

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UILoader.cpp
# Opt level: O0

void UI::LoaderLoadSceneModal(shared_ptr<LoaderThread> *loader_thread)

{
  bool bVar1;
  ImGuiStyle *pIVar2;
  char *in_RDI;
  float fVar3;
  bool *unaff_retaddr;
  char *in_stack_00000008;
  char **in_stack_00000010;
  float button_width;
  char *kFilter [1];
  char *in_stack_00000038;
  LoaderThread *in_stack_00000040;
  ImVec2 *size_arg;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  float in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  char *label;
  
  ImGui::SetNextWindowCentering();
  bVar1 = ImGui::BeginPopupModal
                    (in_stack_00000008,unaff_retaddr,(ImGuiWindowFlags)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    label = "*.obj";
    size_arg = (ImVec2 *)&stack0xfffffffffffffff0;
    ImGui::FileOpen(unaff_retaddr,in_RDI,"*.obj",
                    CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                    (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    (int)in_stack_ffffffffffffffdc,in_stack_00000010);
    ImGui::DragInt(label,(int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                   in_stack_ffffffffffffffe4,(int)in_stack_ffffffffffffffe0,
                   (int)in_stack_ffffffffffffffdc,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (ImGuiSliderFlags)((ulong)size_arg >> 0x20));
    fVar3 = ImGui::GetWindowContentRegionWidth();
    pIVar2 = ImGui::GetStyle();
    fVar3 = (fVar3 - (pIVar2->ItemSpacing).x) * 0.5;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe4,fVar3,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          size_arg);
    if (bVar1) {
      std::__shared_ptr_access<LoaderThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<LoaderThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x188069);
      LoaderThread::Launch(in_stack_00000040,in_stack_00000038,loader_thread._4_4_);
      ImGui::CloseCurrentPopup();
    }
    ImGui::SetItemDefaultFocus();
    ImGui::SameLine(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffdc,fVar3,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          size_arg);
    if (bVar1) {
      ImGui::CloseCurrentPopup();
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void LoaderLoadSceneModal(const std::shared_ptr<LoaderThread> &loader_thread) {
	ImGui::SetNextWindowCentering();
	if (ImGui::BeginPopupModal(kLoaderLoadSceneModal, nullptr,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar |
	                               ImGuiWindowFlags_NoMove)) {
		static char name_buf[kFilenameBufSize];
		static int octree_leve = 10;

		constexpr const char *kFilter[] = {"*.obj"};

		ImGui::FileOpen("OBJ Filename", "...", name_buf, kFilenameBufSize, "OBJ Filename", 1, kFilter);
		ImGui::DragInt("Octree Level", &octree_leve, 1, kOctreeLevelMin, kOctreeLevelMax);

		float button_width = (ImGui::GetWindowContentRegionWidth() - ImGui::GetStyle().ItemSpacing.x) * 0.5f;

		if (ImGui::Button("Load", {button_width, 0})) {
			loader_thread->Launch(name_buf, octree_leve);
			ImGui::CloseCurrentPopup();
		}
		ImGui::SetItemDefaultFocus();
		ImGui::SameLine();
		if (ImGui::Button("Cancel", {button_width, 0}))
			ImGui::CloseCurrentPopup();

		ImGui::EndPopup();
	}
}